

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.h
# Opt level: O1

long __thiscall cppcms::session_interface::get<long>(session_interface *this,string *key)

{
  bad_cast *this_00;
  long value;
  istringstream ss;
  locale alStack_1b8 [8];
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  long local_190 [4];
  uint auStack_170 [22];
  ios_base local_118 [264];
  
  cppcms::session_interface::get((string *)local_1b0);
  std::__cxx11::istringstream::istringstream((istringstream *)local_190,(string *)local_1b0,_S_in);
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0]);
  }
  std::locale::classic();
  std::ios::imbue(alStack_1b8);
  std::locale::~locale(alStack_1b8);
  std::istream::_M_extract<long>(local_190);
  if ((*(uint *)((long)auStack_170 + *(long *)(local_190[0] + -0x18)) & 7) == 2) {
    std::__cxx11::istringstream::~istringstream((istringstream *)local_190);
    std::ios_base::~ios_base(local_118);
    return (long)local_1b0[0];
  }
  this_00 = (bad_cast *)__cxa_allocate_exception(0x28);
  *(undefined8 *)this_00 = 0;
  (this_00->super_backtrace)._vptr_backtrace = (_func_int **)0x0;
  (this_00->super_backtrace).frames_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->super_backtrace).frames_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->super_backtrace).frames_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  booster::bad_cast::bad_cast(this_00);
  __cxa_throw(this_00,&booster::bad_cast::typeinfo,booster::bad_cast::~bad_cast);
}

Assistant:

T get(std::string const &key)
	{
		std::istringstream ss(get(key));
		ss.imbue(std::locale::classic());
		T value;
		ss>>value;
		if(ss.fail() || !ss.eof())
			throw booster::bad_cast();
		return value;
	}